

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<bool> * __thiscall
VW::config::typed_option<bool>::value(typed_option<bool> *this,bool value)

{
  typed_option<bool> *in_RDI;
  bool *in_stack_00000008;
  shared_ptr<bool> *in_stack_ffffffffffffffe0;
  
  std::make_shared<bool,bool&>(in_stack_00000008);
  std::shared_ptr<bool>::operator=(in_stack_ffffffffffffffe0,(shared_ptr<bool> *)in_RDI);
  std::shared_ptr<bool>::~shared_ptr((shared_ptr<bool> *)0x130dc9);
  return in_RDI;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }